

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * calculateFiller(qsizetype padding,char32_t fillChar,qsizetype fieldWidth,
                         QLocaleData *localeData)

{
  long lVar1;
  int in_EDX;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar2;
  QString *filler;
  char32_t in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  QString *in_stack_ffffffffffffff40;
  QString *pQVar3;
  QLocaleData *in_stack_ffffffffffffff58;
  qsizetype in_stack_ffffffffffffffa8;
  QString *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = in_RDI;
  QString::QString((QString *)0x4cd277);
  if (in_EDX == 0x30) {
    QLocaleData::zeroDigit(in_stack_ffffffffffffff58);
    QString::operator=(in_stack_ffffffffffffff40,
                       (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QString::~QString((QString *)0x4cd2b1);
  }
  else {
    QChar::fromUcs4(in_stack_ffffffffffffff38);
    QVar2 = QChar::fromUcs4(char32_t)::R::operator_cast_to_QStringView
                      ((R_conflict4 *)in_stack_ffffffffffffff58);
    QVar2.m_data = (storage_type_conflict *)QVar2.m_size;
    QVar2.m_size = (qsizetype)pQVar3;
    QString::QString(in_RDI,QVar2);
    QString::operator=(in_stack_ffffffffffffff40,
                       (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QString::~QString((QString *)0x4cd336);
  }
  if (1 < in_RSI) {
    QString::repeated(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    QString::operator=(in_stack_ffffffffffffff40,
                       (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QString::~QString((QString *)0x4cd36d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

static QString calculateFiller(qsizetype padding,
                               char32_t fillChar,
                               [[maybe_unused]] qsizetype fieldWidth,
                               const QLocaleData *localeData)
{
    QString filler;
    if (fillChar == U'0') {
        Q_ASSERT(fieldWidth < 0);
        filler = localeData->zeroDigit();
    } else {
        filler = QString(QChar::fromUcs4(fillChar));
    }
    // ### size is not width
    if (padding > 1)
        filler = filler.repeated(padding);
    return filler;
}